

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

uchar ComputeChecksumRPLIDAR(uchar *req,int reqlen)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 1;
  if (1 < reqlen) {
    iVar2 = reqlen;
  }
  bVar1 = 0;
  for (uVar3 = 0; iVar2 - 1 != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = bVar1 ^ req[uVar3];
  }
  return bVar1;
}

Assistant:

inline unsigned char ComputeChecksumRPLIDAR(unsigned char* req, int reqlen)
{
	int i = 0;
	unsigned char res = 0;

	while (i < reqlen-NB_BYTES_CHECKSUM_RPLIDAR)
	{
		res ^= req[i];
		i++;
	}
	return res;
}